

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall google::protobuf::MapKey::SetType(MapKey *this,CppType type)

{
  string *psVar1;
  int in_ESI;
  undefined8 *in_RDI;
  
  if (*(int *)(in_RDI + 1) != in_ESI) {
    if ((*(int *)(in_RDI + 1) == 9) && (psVar1 = (string *)*in_RDI, psVar1 != (string *)0x0)) {
      std::__cxx11::string::~string(psVar1);
      operator_delete(psVar1);
    }
    *(int *)(in_RDI + 1) = in_ESI;
    if (*(int *)(in_RDI + 1) == 9) {
      psVar1 = (string *)operator_new(0x20);
      std::__cxx11::string::string(psVar1);
      *in_RDI = psVar1;
    }
  }
  return;
}

Assistant:

void SetType(FieldDescriptor::CppType type) {
    if (type_ == type) return;
    if (type_ == FieldDescriptor::CPPTYPE_STRING) {
      delete val_.string_value_;
    }
    type_ = type;
    if (type_ == FieldDescriptor::CPPTYPE_STRING) {
      val_.string_value_ = new std::string;
    }
  }